

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O3

bool __thiscall
ON_3dmObjectAttributes::Internal_ReadV5(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  ON_SectionStyle *pOVar1;
  bool bVar2;
  active_space aVar3;
  SectionAttributesSource source;
  SectionFillRule rule;
  SectionLabelStyle style;
  object_decoration oVar4;
  wchar_t *candidate_name;
  long lVar5;
  ON_Xform *pOVar6;
  ON_Plane *pOVar7;
  ON_Linetype *pOVar8;
  ON_Plane *pOVar9;
  bool bVar10;
  byte bVar11;
  uchar itemid;
  int minor_version;
  bool clipping_proof;
  int major_version;
  ON_wString name;
  byte local_e5;
  uint local_e4;
  double local_e0;
  int local_d4;
  ON_Linetype local_d0;
  
  bVar11 = 0;
  local_e5 = 0xff;
  local_d4 = 0;
  local_e4 = 0;
  bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_d4,(int *)&local_e4);
  if (!bVar2) {
    return false;
  }
  if (local_d4 != 2) {
    return false;
  }
  bVar2 = ON_BinaryArchive::ReadUuid(file,&this->m_uuid);
  if (!bVar2) {
    return false;
  }
  bVar2 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Layer,&this->m_layer_index);
  if (!bVar2) {
    return false;
  }
  bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
  if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  if (local_e5 == 1) {
    ON_wString::ON_wString((ON_wString *)&local_d0);
    bVar2 = ON_BinaryArchive::ReadString(file,(ON_wString *)&local_d0);
    if (bVar2) {
      candidate_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_d0);
      SetName(this,candidate_name,true);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (bVar2 && local_e5 != 0) {
        ON_wString::~ON_wString((ON_wString *)&local_d0);
        goto LAB_0036bad4;
      }
    }
    else {
      bVar2 = false;
    }
    ON_wString::~ON_wString((ON_wString *)&local_d0);
    goto LAB_0036c01b;
  }
LAB_0036bad4:
  if (local_e5 == 2) {
    bVar2 = ON_BinaryArchive::ReadString(file,&this->m_url);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
    if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  }
  if (local_e5 == 3) {
    bVar2 = ON_BinaryArchive::Read3dmReferencedComponentIndex
                      (file,LinePattern,&this->m_linetype_index);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
    if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  }
  if (local_e5 == 4) {
    bVar2 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Material,&this->m_material_index)
    ;
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
    if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  }
  if (local_e5 == 5) {
    bVar2 = ON_ObjectRenderingAttributes::Read(&this->m_rendering_attributes,file);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
    if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  }
  if (local_e5 == 6) {
    bVar2 = ON_BinaryArchive::ReadColor(file,&this->m_color);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
    if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  }
  if (local_e5 == 7) {
    bVar2 = ON_BinaryArchive::ReadColor(file,&this->m_plot_color);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
    if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  }
  if (local_e5 == 8) {
    bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_plot_weight_mm);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
    if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
  }
  if (local_e5 == 9) {
    local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
         (_func_int **)
         ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
         0xffffffffffffff00);
    bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
    if (bVar2) {
      oVar4 = ON::ObjectDecoration
                        ((uint)(byte)local_d0.super_ON_ModelComponent.super_ON_Object.
                                     _vptr_ON_Object);
      this->m_object_decoration = oVar4;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      goto LAB_0036bce3;
    }
LAB_0036c8ae:
    bVar2 = false;
  }
  else {
LAB_0036bce3:
    if (local_e5 == 10) {
      bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_wire_density);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0xb) {
      bVar2 = ON_BinaryArchive::ReadBool(file,&this->m_bVisible);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0xc) {
      bVar2 = ON_BinaryArchive::ReadChar(file,&this->m_mode);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0xd) {
      bVar2 = ON_BinaryArchive::ReadChar(file,&this->m_color_source);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0xe) {
      bVar2 = ON_BinaryArchive::ReadChar(file,&this->m_plot_color_source);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0xf) {
      bVar2 = ON_BinaryArchive::ReadChar(file,&this->m_plot_weight_source);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0x10) {
      bVar2 = ON_BinaryArchive::ReadChar(file,&this->m_material_source);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0x11) {
      bVar2 = ON_BinaryArchive::ReadChar(file,&this->m_linetype_source);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0x12) {
      bVar2 = ON_BinaryArchive::Read3dmReferencedComponentIndexArray(file,Group,&this->m_group);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0x13) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      aVar3 = ON::ActiveSpace((uint)(byte)local_d0.super_ON_ModelComponent.super_ON_Object.
                                          _vptr_ON_Object);
      this->m_space = aVar3;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
    }
    if (local_e5 == 0x14) {
      bVar2 = ON_BinaryArchive::ReadUuid(file,&this->m_viewport_id);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (local_e5 == 0 || !bVar2) goto LAB_0036c01b;
    }
    if (local_e5 == 0x15) {
      bVar2 = ON_BinaryArchive::ReadArray(file,&this->m_dmref);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if ((int)local_e4 < 1 || (local_e5 == 0 || !bVar2)) goto LAB_0036c01b;
    }
    else {
      bVar2 = true;
      if ((int)local_e4 < 1) goto LAB_0036c01b;
    }
    if (local_e5 == 0x16) {
      bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_display_order);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (((!bVar2) || (local_e5 == 0)) || ((int)local_e4 < 2)) goto LAB_0036c01b;
    }
    else if (local_e4 < 2) goto LAB_0036c01b;
    if (local_e5 == 0x17) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x18) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x19) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x1a) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if ((int)local_e4 < 3) goto LAB_0036c01b;
    if (local_e5 == 0x1b) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x1c) {
      local_e0 = (double)((ulong)local_e0 & 0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadBool(file,(bool *)&local_e0);
      if (!bVar2) {
        return false;
      }
      ON_UuidList::ON_UuidList((ON_UuidList *)&local_d0);
      bVar2 = ON_UuidList::Read((ON_UuidList *)&local_d0,file);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
        if (bVar2 && local_e5 != 0) {
          ON_UuidList::~ON_UuidList((ON_UuidList *)&local_d0);
          bVar2 = true;
          goto LAB_0036c26c;
        }
      }
      else {
        bVar2 = false;
      }
      ON_UuidList::~ON_UuidList((ON_UuidList *)&local_d0);
      goto LAB_0036c01b;
    }
LAB_0036c26c:
    if ((int)local_e4 < 4) goto LAB_0036c01b;
    if (local_e5 == 0x1d) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      source = ON::SectionAttributesSourceFromUnsigned
                         ((uint)(byte)local_d0.super_ON_ModelComponent.super_ON_Object.
                                      _vptr_ON_Object);
      SetSectionAttributesSource(this,source);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x1e) {
      local_e0 = (double)((ulong)local_e0 & 0xffffffff00000000);
      bVar2 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,HatchPattern,(int *)&local_e0);
      if (!bVar2) goto LAB_0036c8ae;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if ((this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) &&
         (pOVar1 = (this->m_private->m_custom_section_style).
                   super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         pOVar1 != (ON_SectionStyle *)0x0)) {
        ON_SectionStyle::operator=((ON_SectionStyle *)&local_d0,pOVar1);
      }
      ON_SectionStyle::SetHatchIndex((ON_SectionStyle *)&local_d0,local_e0._0_4_);
      SetCustomSectionStyle(this,(ON_SectionStyle *)&local_d0);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      bVar10 = local_e5 == 0;
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if (!bVar2 || bVar10) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x1f) {
      local_e0 = 1.0;
      bVar2 = ON_BinaryArchive::ReadDouble(file,&local_e0);
      if (!bVar2) goto LAB_0036c8ae;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if ((this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) &&
         (pOVar1 = (this->m_private->m_custom_section_style).
                   super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         pOVar1 != (ON_SectionStyle *)0x0)) {
        ON_SectionStyle::operator=((ON_SectionStyle *)&local_d0,pOVar1);
      }
      ON_SectionStyle::SetHatchScale((ON_SectionStyle *)&local_d0,local_e0);
      SetCustomSectionStyle(this,(ON_SectionStyle *)&local_d0);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      bVar10 = local_e5 == 0;
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if (!bVar2 || bVar10) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x20) {
      local_e0 = 0.0;
      bVar2 = ON_BinaryArchive::ReadDouble(file,&local_e0);
      if (!bVar2) goto LAB_0036c8ae;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if ((this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) &&
         (pOVar1 = (this->m_private->m_custom_section_style).
                   super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         pOVar1 != (ON_SectionStyle *)0x0)) {
        ON_SectionStyle::operator=((ON_SectionStyle *)&local_d0,pOVar1);
      }
      ON_SectionStyle::SetHatchRotation((ON_SectionStyle *)&local_d0,local_e0);
      SetCustomSectionStyle(this,(ON_SectionStyle *)&local_d0);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      bVar10 = local_e5 == 0;
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if (!bVar2 || bVar10) goto LAB_0036c01b;
      bVar2 = true;
    }
    if ((int)local_e4 < 5) goto LAB_0036c01b;
    if (local_e5 == 0x21) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)0x3ff0000000000000;
      bVar2 = ON_BinaryArchive::ReadDouble(file,(double *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      SetLinetypePatternScale
                (this,(double)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if ((int)local_e4 < 6) goto LAB_0036c01b;
    if (local_e5 == 0x22) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           CONCAT44(local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._4_4_,
                    ON_Color::UnsetColor.field_0);
      bVar2 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      SetHatchBackgroundFillColor(this,(ON_Color *)&local_d0);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (local_e5 == 0x23) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadBool(file,(bool *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      SetHatchBoundaryVisible
                (this,(bool)(byte)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if ((int)local_e4 < 8) goto LAB_0036c01b;
    if (local_e5 == 0x24) {
      pOVar6 = &ON_Xform::Nan;
      pOVar8 = &local_d0;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pOVar8->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
             (_func_int **)pOVar6->m_xform[0][0];
        pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar11 * -2 + 1) * 8);
        pOVar8 = (ON_Linetype *)((long)pOVar8 + ((ulong)bVar11 * -2 + 1) * 8);
      }
      bVar2 = ON_BinaryArchive::ReadXform(file,(ON_Xform *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      pOVar7 = &ON_Plane::World_xy;
      pOVar9 = &this->m_object_frame;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pOVar9->origin).x = (pOVar7->origin).x;
        pOVar7 = (ON_Plane *)((long)pOVar7 + ((ulong)bVar11 * -2 + 1) * 8);
        pOVar9 = (ON_Plane *)((long)pOVar9 + (ulong)bVar11 * -0x10 + 8);
      }
      ON_Plane::Transform(&this->m_object_frame,(ON_Xform *)&local_d0);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if ((int)local_e4 < 9) goto LAB_0036c01b;
    if (local_e5 == 0x25) {
      local_e0 = (double)((ulong)local_e0 & 0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_e0);
      if (!bVar2) goto LAB_0036c8ae;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if ((this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) &&
         (pOVar1 = (this->m_private->m_custom_section_style).
                   super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         pOVar1 != (ON_SectionStyle *)0x0)) {
        ON_SectionStyle::operator=((ON_SectionStyle *)&local_d0,pOVar1);
      }
      rule = ON::SectionFillRuleFromUnsigned((uint)local_e0._0_1_);
      ON_SectionStyle::SetSectionFillRule((ON_SectionStyle *)&local_d0,rule);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      bVar10 = local_e5 == 0;
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_d0);
      if (!bVar2 || bVar10) goto LAB_0036c01b;
      bVar2 = true;
    }
    if ((int)local_e4 < 10) goto LAB_0036c01b;
    if (local_e5 == 0x26) {
      ON_Linetype::ON_Linetype(&local_d0);
      bVar2 = ON_Linetype::Read(&local_d0,file);
      if (bVar2) {
        SetCustomLinetype(this,&local_d0);
        bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
        if (bVar2 && local_e5 != 0) {
          ON_Linetype::~ON_Linetype(&local_d0);
          bVar2 = true;
          goto LAB_0036c75c;
        }
      }
      else {
        bVar2 = false;
      }
      ON_Linetype::~ON_Linetype(&local_d0);
      goto LAB_0036c01b;
    }
LAB_0036c75c:
    if ((int)local_e4 < 0xb) goto LAB_0036c01b;
    if (local_e5 == 0x27) {
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_d0);
      bVar2 = ON_SectionStyle::Read((ON_SectionStyle *)&local_d0,file);
      if (bVar2) {
        SetCustomSectionStyle(this,(ON_SectionStyle *)&local_d0);
        bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
        if (bVar2 && local_e5 != 0) {
          ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_d0);
          bVar2 = true;
          goto LAB_0036c7ca;
        }
      }
      else {
        bVar2 = false;
      }
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_d0);
      goto LAB_0036c01b;
    }
LAB_0036c7ca:
    if ((int)local_e4 < 0xc) goto LAB_0036c01b;
    if (local_e5 == 0x28) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar2 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      style = ON::SectionLabelStyleFromUnsigned
                        ((uint)(byte)local_d0.super_ON_ModelComponent.super_ON_Object.
                                     _vptr_ON_Object);
      SetClippingPlaneLabelStyle(this,style);
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if ((int)local_e4 < 0xd) goto LAB_0036c01b;
    if (local_e5 == 0x29) {
      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           CONCAT71(local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._1_7_,1);
      bVar2 = ON_BinaryArchive::ReadBool(file,(bool *)&local_d0);
      if (!bVar2) goto LAB_0036c8ae;
      bVar2 = ON_BinaryArchive::ReadChar(file,&local_e5);
      if (!bVar2 || local_e5 == 0) goto LAB_0036c01b;
      bVar2 = true;
    }
    if (0x29 < local_e5 && 0xd < (int)local_e4) {
      local_e5 = 0;
    }
  }
LAB_0036c01b:
  if ((bVar2 != false) && (local_e5 != 0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
               ,0x392,"","Bug in ON_3dmObjectAttributes::ReadV5Helper or WriteV5Helper");
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ON_3dmObjectAttributes::Internal_ReadV5( ON_BinaryArchive& file )
{
  unsigned char itemid = 0xFF;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && 2 != major_version )
    rc = false;

  while(rc)
  {
    if (!rc) break;
    rc = file.ReadUuid(m_uuid);
    if (!rc) break;
    //rc = file.ReadInt(&m_layer_index);
    rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, &m_layer_index);
    if (!rc) break;

    // read non-default settings - skip everything else
    rc = file.ReadChar(&itemid);
    if (!rc) break;
    if ( 0 == itemid )
      break;
    
    if ( 1 == itemid )
    {
      ON_wString name;
      rc = file.ReadString(name);
      if (!rc) break;
      SetName(name,true);

      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 2 == itemid )
    {
      rc = file.ReadString(m_url);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 3 == itemid )
    {
      //rc = file.ReadInt(&m_linetype_index);
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::LinePattern, &m_linetype_index);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 4 == itemid )
    {
      //rc = file.ReadInt(&m_material_index);
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial, &m_material_index);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 5 == itemid )
    {
      rc = m_rendering_attributes.Read(file);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 6 == itemid )
    {
      rc = file.ReadColor(m_color);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 7 == itemid )
    {
      rc = file.ReadColor(m_plot_color);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 8 == itemid )
    {
      rc = file.ReadDouble(&m_plot_weight_mm);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 9 == itemid )
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      m_object_decoration = ON::ObjectDecoration(c);
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 10 == itemid )
    {
      rc = file.ReadInt(&m_wire_density);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 11 == itemid )
    {
      rc = file.ReadBool(&m_bVisible);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 12 == itemid )
    {
      rc = file.ReadChar(&m_mode);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 13 == itemid )
    {
      rc = file.ReadChar(&m_color_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 14 == itemid )
    {
      rc = file.ReadChar(&m_plot_color_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 15 == itemid )
    {
      rc = file.ReadChar(&m_plot_weight_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 16 == itemid )
    {
      rc = file.ReadChar(&m_material_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 17 == itemid )
    {
      rc = file.ReadChar(&m_linetype_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 18 == itemid )
    {
      rc = file.Read3dmReferencedComponentIndexArray(ON_ModelComponent::Type::Group, m_group);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 19 == itemid )
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      m_space = ON::ActiveSpace(c);
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 20 == itemid )
    {
      rc = file.ReadUuid(m_viewport_id);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 21 == itemid )
    {
      rc = file.ReadArray(m_dmref);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }

    // items 1 - 21 are in chunk version 2.0 files
    if ( minor_version <= 0 )
      break;

    // 28 Nov. 2009 - S. Baer
    // Added m_display_order to version 2.1 files
    if ( 22 == itemid )
    {
      rc = file.ReadInt(&m_display_order);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }

    if ( minor_version <= 1 )
      break;

    // 12 Aug 2021 S. Baer
    // Items 23, 24, 25, 26 were in a version of Rhino 8 WIP for about 24 hours.
    // They were most likely never used by anyone, but just in case let's test,
    // read, and throw away.
    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineCapStyleSource == itemid) //23
    {
      unsigned char source = 0;
      rc = file.ReadChar(&source);
      if (!rc) break;
      //SetLineCapStyleSource(ON::ObjectLineCapStyleSourceFromUnsigned(source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineCapStyle == itemid) //24
    {
      unsigned char style = 0;
      rc = file.ReadChar(&style);
      if (!rc) break;
      //SetLineCapStyle(ON::LineCapStyleFromUnsigned(style));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineJoinStyleSource == itemid) //25
    {
      unsigned char source = 0;
      rc = file.ReadChar(&source);
      if (!rc) break;
      //SetLineJoinStyleSource(ON::ObjectLineJoinStyleSourceFromUnsigned(source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineJoinStyle == itemid) //26
    {
      unsigned char style = 0;
      rc = file.ReadChar(&style);
      if (!rc) break;
      //SetLineJoinStyle(ON::LineJoinStyleFromUnsigned(style));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 2)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteClipParticipationSource == itemid) //27
    {
      unsigned char clip_participation_source = 0;
      rc = file.ReadChar(&clip_participation_source);
      if (!rc) break;
      //SetClipParticipationSource(ON::ClipParticipationSourceFromUnsigned(clip_participation_source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::SelectiveClippingData == itemid) //28
    {
      bool clipping_proof = false;
      rc = file.ReadBool(&clipping_proof);
      if (!rc) break;
      ON_UuidList selectiveClipping;
      rc = selectiveClipping.Read(file);
      if (!rc) break;
      //if (clipping_proof)
      //  SetClipParticipationForNone();
      //else
      //{
      //  if (selectiveClipping.Count() > 0)
      //  {
      //    SetClipParticipationList(selectiveClipping.Array(), selectiveClipping.Count(), true);
      //  }
      //}
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 3)
      break;

    if (ON_3dmObjectAttributesTypeCodes::SectionAttributesSource == itemid) //29
    {
      unsigned char section_attr_source = 0;
      rc = file.ReadChar(&section_attr_source);
      if (!rc) break;
      SetSectionAttributesSource(ON::SectionAttributesSourceFromUnsigned(section_attr_source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchIndex == itemid) //30
    {
      int hatch_index = 0;
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, &hatch_index);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchIndex(hatch_index);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchScale == itemid) //31
    {
      double hatch_scale = 1;
      rc = file.ReadDouble(&hatch_scale);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchScale(hatch_scale);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchRotation == itemid) //32
    {
      double hatch_rotation = 0;
      rc = file.ReadDouble(&hatch_rotation);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchRotation(hatch_rotation);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 4)
      break;

    if (ON_3dmObjectAttributesTypeCodes::LinetypeScale == itemid) //33
    {
      double scale = 1.0;
      rc = file.ReadDouble(&scale);
      if (!rc) break;
      SetLinetypePatternScale(scale);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 5)
      break;

    if (ON_3dmObjectAttributesTypeCodes::HatchBackgroundFill == itemid) // 34
    {
      ON_Color color = ON_Color::UnsetColor;
      rc = file.ReadColor(color);
      if (!rc) break;
      SetHatchBackgroundFillColor(color);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::HatchBoundaryVisible == itemid) // 35
    {
      bool visible = false;
      rc = file.ReadBool(&visible);
      if (!rc) break;
      SetHatchBoundaryVisible(visible);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 6)
      break;

    // nothing added in 2.7
    if (minor_version <= 7)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObjectFrame == itemid) // 36
    {
      ON_Xform object_frame = ON_Xform::Nan;
      rc = file.ReadXform(object_frame);
      if (!rc) break;

      m_object_frame = ON_Plane::World_xy;
      m_object_frame.Transform(object_frame);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 8)
      break;

    if (ON_3dmObjectAttributesTypeCodes::SectionFillRule == itemid) // 37
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetSectionFillRule(ON::SectionFillRuleFromUnsigned(c));

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 9)
      break;

    if (ON_3dmObjectAttributesTypeCodes::CustomLinetype == itemid) // 38
    {
      ON_Linetype lt;
      rc = lt.Read(file);
      if (!rc) break;

      SetCustomLinetype(lt);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 10)
      break;

    if (ON_3dmObjectAttributesTypeCodes::CustomSectionStyle == itemid) // 39
    {
      ON_SectionStyle sectionStyle;
      rc = sectionStyle.Read(file);
      if (!rc) break;

      SetCustomSectionStyle(sectionStyle);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 11)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ClippingPlaneLabelStyle == itemid) // 40
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      SetClippingPlaneLabelStyle(ON::SectionLabelStyleFromUnsigned(c));

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 12)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteSelectiveClippingListType == itemid) // 41
    {
      bool b = true;
      rc = file.ReadBool(&b);
      if (!rc) break;
      //if (nullptr == m_private)
      //  m_private = new ON_3dmObjectAttributesPrivate(this);
      //m_private->m_clipplane_list_is_participation = b;

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 13)
      break;

    // Add new item reading above and increment the LastAttributeTypeCode value
    // in the enum. Be sure to test reading of old and new files by old and new
    // code, before checking in your changes.
    //
    if ( itemid > ON_3dmObjectAttributesTypeCodes::LastAttributeTypeCode )
    {
      // we are reading file written with code newer
      // than this code (minor_version > 2)
      itemid = 0;
    }

    break;
  }

  if ( rc && 0 != itemid )
  {
    ON_ERROR("Bug in ON_3dmObjectAttributes::ReadV5Helper or WriteV5Helper");
  }

  return rc;
}